

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

void __thiscall
Clasp::Solver::otfs(Solver *this,Antecedent *lhs,Antecedent *rhs,Literal p,bool final)

{
  long *plVar1;
  pointer pAVar2;
  uint uVar3;
  ClauseHead *pCVar4;
  ClauseHead *pCVar5;
  ClauseHead *pCVar6;
  ClauseHead *pCVar7;
  uint uVar8;
  
  plVar1 = (long *)lhs->data_;
  if (((ulong)plVar1 & 3) == 0 && plVar1 != (long *)0x0) {
    pCVar4 = (ClauseHead *)(**(code **)(*plVar1 + 0x48))();
  }
  else {
    pCVar4 = (ClauseHead *)0x0;
  }
  plVar1 = (long *)rhs->data_;
  if (((ulong)plVar1 & 3) == 0 && plVar1 != (long *)0x0) {
    pCVar5 = (ClauseHead *)(**(code **)(*plVar1 + 0x48))();
  }
  else {
    pCVar5 = (ClauseHead *)0x0;
  }
  pCVar6 = pCVar4;
  if (pCVar4 != (ClauseHead *)0x0) {
    uVar3 = (*(pCVar4->super_Constraint)._vptr_Constraint[0x16])
                      (pCVar4,this,(ulong)(p.rep_ & 0xfffffffe ^ 2),(ulong)!final);
    if ((uVar3 & 1) == 0) {
      pCVar6 = (ClauseHead *)0x0;
    }
    else {
      uVar8 = uVar3 >> 8 & 1;
      pCVar6 = (ClauseHead *)0x0;
      if (uVar8 == 0) {
        pCVar6 = pCVar4;
      }
      if ((byte)((byte)uVar8 & (byte)uVar3) == 1) {
        pCVar6 = otfsRemove(this,pCVar4,(LitVec *)0x0);
      }
    }
  }
  lhs->data_ = (uint64)pCVar6;
  if (pCVar5 == (ClauseHead *)0x0) {
    return;
  }
  uVar3 = (*(pCVar5->super_Constraint)._vptr_Constraint[0x16])
                    (pCVar5,this,(ulong)p.rep_,(ulong)!final);
  if ((uVar3 & 1) != 0) {
    pCVar4 = pCVar5;
    if ((uVar3 >> 8 & 1) == 0) goto LAB_0016c2bf;
    pCVar7 = otfsRemove(this,pCVar5,(LitVec *)0x0);
    pCVar4 = pCVar7;
    if (pCVar7 != (ClauseHead *)0x0) {
      pCVar4 = pCVar5;
    }
    if ((pCVar7 == (ClauseHead *)0x0 & (byte)uVar3) != 1) goto LAB_0016c2bf;
    pAVar2 = (this->assign_).reason_.super_type.ebo_.buf;
    if ((ClauseHead *)pAVar2[p.rep_ >> 2].data_ == pCVar5) {
      pAVar2[p.rep_ >> 2].data_ = 0;
    }
  }
  pCVar4 = (ClauseHead *)0x0;
LAB_0016c2bf:
  if ((pCVar6 != (ClauseHead *)0x0) && (pCVar4 != (ClauseHead *)0x0)) {
    pCVar5 = pCVar6;
    if (((pCVar6->info_).super_ConstraintScore.rep & 0x30000000) == 0) {
      pCVar5 = pCVar4;
      pCVar4 = pCVar6;
    }
    otfsRemove(this,pCVar5,(LitVec *)0x0);
  }
  lhs->data_ = (uint64)pCVar4;
  return;
}

Assistant:

void Solver::otfs(Antecedent& lhs, const Antecedent& rhs, Literal p, bool final) {
	ClauseHead* cLhs = clause(lhs), *cRhs = clause(rhs);
	ClauseHead::BoolPair x;
	if (cLhs) {
		x = cLhs->strengthen(*this, ~p, !final);
		if (!x.first || x.second) {
			cLhs = !x.first ? 0 : otfsRemove(cLhs, 0);
		}
	}
	lhs = cLhs;
	if (cRhs) {
		x = cRhs->strengthen(*this, p, !final);
		if (!x.first || (x.second && otfsRemove(cRhs, 0) == 0)) {
			if (x.first && reason(p) == cRhs) { setReason(p, 0); }
			cRhs = 0;
		}
		if (cLhs && cRhs) {
			// lhs and rhs are now equal - only one of them is needed
			if (!cLhs->learnt()) {
				std::swap(cLhs, cRhs);
			}
			otfsRemove(cLhs, 0);
		}
		lhs = cRhs;
	}
}